

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O3

_Bool borg_obj_has_effect(uint32_t kind,wchar_t index,wchar_t subtype)

{
  effect *peVar1;
  
  peVar1 = k_info[kind].effect;
  do {
    if (peVar1 == (effect *)0x0) {
      return false;
    }
    if ((uint)peVar1->index == index) {
      if (subtype == L'\xffffffff') {
        return true;
      }
      if (peVar1->subtype == subtype) {
        return true;
      }
    }
    peVar1 = peVar1->next;
  } while( true );
}

Assistant:

bool borg_obj_has_effect(uint32_t kind, int index, int subtype)
{
    struct effect* ke = k_info[kind].effect;
    while (ke) {
        if (ke->index == index && (ke->subtype == subtype || subtype == -1))
            return true;
        ke = ke->next;
    }
    return false;
}